

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<const_void_*>::dispose(ArrayBuilder<const_void_*> *this)

{
  Entry *firstElement;
  long lVar1;
  long lVar2;
  Entry *endCopy;
  Entry *posCopy;
  Entry *ptrCopy;
  ArrayBuilder<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
  *this_local;
  
  firstElement = *(Entry **)this;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  if (firstElement != (Entry *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    ArrayDisposer::dispose<void_const*>
              (*(ArrayDisposer **)(this + 0x18),firstElement,lVar1 - (long)firstElement >> 3,
               lVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }